

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragBehaviorT<unsigned_int,int,float>
               (ImGuiDataType data_type,uint *v,float v_speed,uint v_min,uint v_max,char *format,
               float power,ImGuiDragFlags flags)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint uVar4;
  ImGuiInputSource IVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec2 local_50;
  undefined1 local_48 [16];
  
  pIVar2 = GImGui;
  uVar4 = data_type & 0xfffffffe;
  if (v_max < v_min) {
    return false;
  }
  if (v_speed == 0.0 && (v_min <= v_max && v_max - v_min != 0)) {
    v_speed = (float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  uVar7 = flags & 1;
  IVar5 = GImGui->ActiveIdSource;
  if (IVar5 == ImGuiInputSource_Mouse) {
    bVar3 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar3) || ((pIVar2->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      IVar5 = pIVar2->ActiveIdSource;
      goto LAB_003571f1;
    }
    fVar12 = (pIVar2->IO).NavInputs[(ulong)uVar7 + 0x1e];
    if ((pIVar2->IO).KeyAlt != false) {
      fVar12 = fVar12 * 0.01;
    }
    if ((pIVar2->IO).KeyShift == true) {
      fVar12 = fVar12 * 10.0;
    }
  }
  else {
LAB_003571f1:
    fVar12 = 0.0;
    if (IVar5 == ImGuiInputSource_Nav) {
      uVar6 = 0;
      if (uVar4 == 8) {
        uVar6 = ImParseFormatPrecision(format,3);
      }
      local_50 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar12 = *(float *)(local_48 + (ulong)uVar7 * 4 + -8);
      if ((int)uVar6 < 0) {
        fVar11 = 1.1754944e-38;
      }
      else if (uVar6 < 10) {
        fVar11 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar6 * 4);
      }
      else {
        local_48 = ZEXT416((uint)fVar12);
        fVar11 = powf(10.0,(float)(int)-uVar6);
        fVar12 = (float)local_48._0_4_;
      }
      v_speed = (float)((uint)v_speed & -(uint)(fVar11 <= v_speed) |
                       ~-(uint)(fVar11 <= v_speed) & (uint)fVar11);
    }
  }
  fVar12 = fVar12 * v_speed;
  fVar11 = fVar12;
  if (uVar7 != 0) {
    fVar11 = -fVar12;
  }
  uVar7 = v_max - v_min;
  if (v_max < v_min || uVar7 == 0) {
    bVar3 = false;
LAB_0035733c:
    bVar1 = false;
  }
  else {
    if ((*v < v_max) || (bVar3 = true, fVar11 <= 0.0)) {
      bVar3 = fVar11 < 0.0 && *v <= v_min;
    }
    if ((v_max <= v_min || uVar4 != 8) || power == 1.0) goto LAB_0035733c;
    if ((fVar11 < 0.0) && (0.0 < pIVar2->DragCurrentAccum)) goto LAB_00357372;
    if (fVar11 <= 0.0) goto LAB_0035733c;
    bVar1 = pIVar2->DragCurrentAccum <= 0.0 && pIVar2->DragCurrentAccum != 0.0;
  }
  if (((pIVar2->ActiveIdIsJustActivated == false) && (!bVar3)) && (!bVar1)) {
    if ((fVar12 != 0.0) || (NAN(fVar12))) {
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum + fVar11;
      pIVar2->DragCurrentAccumDirty = true;
    }
    else if ((pIVar2->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    if ((v_max <= v_min || uVar4 != 8) || power == 1.0) {
      uVar6 = RoundScalarWithFormatT<unsigned_int,int>
                        (format,data_type,*v + (int)pIVar2->DragCurrentAccum);
      pIVar2->DragCurrentAccumDirty = false;
      uVar7 = *v;
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (float)(int)(uVar6 - uVar7);
    }
    else {
      fVar10 = (float)uVar7;
      fVar8 = powf((float)(*v - v_min) / fVar10,1.0 / power);
      fVar9 = pIVar2->DragCurrentAccum / fVar10 + fVar8;
      fVar12 = 1.0;
      if (fVar9 <= 1.0) {
        fVar12 = fVar9;
      }
      fVar12 = powf((float)(~-(uint)(fVar9 < 0.0) & (uint)fVar12),power);
      uVar6 = RoundScalarWithFormatT<unsigned_int,int>(format,data_type,(int)fVar12 * uVar7 + v_min)
      ;
      pIVar2->DragCurrentAccumDirty = false;
      fVar12 = powf((float)(uVar6 - v_min) / fVar10,1.0 / power);
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (fVar12 - fVar8);
      uVar7 = *v;
    }
    if ((v_min < v_max) && (uVar7 != uVar6)) {
      if ((uVar6 < v_min) || (((uVar4 != 8 && (uVar7 < uVar6)) && (fVar11 < 0.0)))) {
        uVar6 = v_min;
      }
      if ((v_max < uVar6) || (((uVar4 != 8 && (uVar6 < uVar7)) && (0.0 < fVar11)))) {
        uVar6 = v_max;
      }
    }
    if (uVar7 == uVar6) {
      return false;
    }
    *v = uVar6;
    return true;
  }
LAB_00357372:
  pIVar2->DragCurrentAccum = 0.0;
  pIVar2->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (SIGNEDTYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}